

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

bool density_tests::detail::
     PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  put;
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  local_48;
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  local_30;
  
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
            (&local_30,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)queue
            );
  local_48.m_queue = local_30.m_queue;
  local_48.m_put_data.m_control_block = local_30.m_put_data.m_control_block;
  local_48.m_put_data.m_user_storage = local_30.m_put_data.m_user_storage;
  local_30.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction(&local_30);
  PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
  ::
  put_impl<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>>
            (&local_48,i_rand);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::commit(&local_48);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction(&local_48);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                auto put = queue.template start_emplace<ElementType>();
                put_impl(put, i_rand);
                put.commit();
                return true;
            }